

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  char *pcVar1;
  u16 *puVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  sqlite3 *db;
  Schema *pSVar7;
  u8 uVar8;
  int iVar9;
  uint iDb;
  int iVar10;
  Pgno PVar11;
  Table *pTVar12;
  Index *pIVar13;
  char *zName;
  Table *pTVar14;
  Expr *pEVar15;
  size_t sVar16;
  Index *pIVar17;
  ExprList *pEVar18;
  Expr *pEVar19;
  CollSeq *pCVar20;
  void *pvVar21;
  Vdbe *p;
  Schema **ppSVar22;
  long lVar23;
  ExprList_item *pEVar24;
  Op *pOVar25;
  char *pcVar26;
  Column *pCVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  char *pcVar31;
  Token *pName_00;
  ExprList_item *pEVar32;
  uchar uVar33;
  uchar uVar34;
  Db *pDVar35;
  u16 uVar36;
  Index **ppIVar37;
  long in_FS_OFFSET;
  char *zExtra;
  Token *pName;
  DbFixer sFix;
  char *local_168;
  ExprList *local_148;
  char *local_128;
  Token *local_120;
  Parse *local_118;
  undefined1 auStack_110 [40];
  anon_union_8_18_67db040d_for_u local_e8;
  Schema *pSStack_e0;
  undefined1 *local_d8;
  char *pcStack_d0;
  char *local_c8;
  Token *pTStack_c0;
  char *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ExprList *local_98;
  SrcList *pSStack_90;
  Expr *local_88;
  ExprList *pEStack_80;
  Expr *local_78;
  ExprList *pEStack_70;
  Select *local_68;
  Select *pSStack_60;
  Expr *local_58;
  With *pWStack_50;
  Window *local_48;
  Window *pWStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pTStack_c0 = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  pSStack_e0 = (Schema *)&DAT_aaaaaaaaaaaaaaaa;
  auStack_110._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_110._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_110._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_110._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  auStack_110._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  db = pParse->db;
  zName = (char *)0x0;
  local_120 = (Token *)0x0;
  local_128 = (char *)0x0;
  if (pParse->nErr != 0) goto LAB_001646b0;
  if ((idxType != '\x02') && (pParse->eParseMode == '\x01')) {
LAB_0016467c:
    zName = (char *)0x0;
    goto LAB_001646b0;
  }
  iVar9 = sqlite3ReadSchema(pParse);
  if ((iVar9 == 0) && (iVar9 = sqlite3HasExplicitNulls(pParse,pList), iVar9 == 0)) {
    if (pTblName == (SrcList *)0x0) {
      pTVar12 = pParse->pNewTable;
      if (pTVar12 == (Table *)0x0) goto LAB_0016467c;
      if (pTVar12->pSchema == (Schema *)0x0) {
        iDb = 0xffff8000;
        pName_00 = (Token *)0x0;
      }
      else {
        iDb = 0xffffffff;
        pName_00 = (Token *)0x0;
        ppSVar22 = &db->aDb->pSchema;
        do {
          iDb = iDb + 1;
          pSVar7 = *ppSVar22;
          ppSVar22 = ppSVar22 + 4;
        } while (pSVar7 != pTVar12->pSchema);
      }
LAB_00164906:
      pIVar13 = (Index *)0x0;
LAB_00164909:
      pDVar35 = db->aDb + (int)iDb;
      zName = pTVar12->zName;
      if (zName != (char *)0x0) {
        lVar23 = 0;
        do {
          if ((ulong)(byte)zName[lVar23] == 0) {
            uVar34 = ""[(byte)"sqlite_"[lVar23]];
            uVar33 = '\0';
LAB_00164960:
            if (uVar33 != uVar34) goto LAB_00164990;
            break;
          }
          uVar33 = ""[(byte)zName[lVar23]];
          uVar34 = ""[(byte)"sqlite_"[lVar23]];
          if (uVar33 != uVar34) goto LAB_00164960;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 7);
        if ((pTblName != (SrcList *)0x0) && ((db->init).busy == '\0')) {
          pcVar31 = "table %s may not be indexed";
          goto LAB_00164981;
        }
      }
LAB_00164990:
      if (pTVar12->eTabType == '\x01') {
        pcVar31 = "virtual tables may not be indexed";
LAB_001649b3:
        zName = (char *)0x0;
        sqlite3ErrorMsg(pParse,pcVar31);
      }
      else {
        if (pTVar12->eTabType == '\x02') {
          pcVar31 = "views may not be indexed";
          goto LAB_001649b3;
        }
        if (pName_00 == (Token *)0x0) {
          for (pIVar17 = pTVar12->pIndex; pIVar17 != (Index *)0x0; pIVar17 = pIVar17->pNext) {
          }
          zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d");
          if (zName == (char *)0x0) {
LAB_00164b92:
            zName = (char *)0x0;
          }
          else {
            if (pParse->eParseMode == '\0') {
LAB_00164acf:
              pcVar31 = pDVar35->zDbSName;
              pcVar26 = "sqlite_master";
              if (iDb == 1) {
                pcVar26 = "sqlite_temp_master";
              }
              iVar9 = sqlite3AuthCheck(pParse,0x12,pcVar26,(char *)0x0,pcVar31);
              if ((iVar9 != 0) ||
                 (iVar9 = sqlite3AuthCheck(pParse,(uint)(iDb == 1) * 2 + 1,zName,pTVar12->zName,
                                           pcVar31), iVar9 != 0)) goto LAB_001649c5;
            }
            else {
              zName[7] = zName[7] + '\x01';
LAB_00164ac6:
              if (pParse->eParseMode < 2) goto LAB_00164acf;
            }
LAB_00164b42:
            if (pList == (ExprList *)0x0) {
              uStack_b0._0_4_ = 0xaaaaaaaa;
              uStack_b0._4_4_ = -0x55555556;
              pCVar27 = pTVar12->aCol;
              sVar4 = pTVar12->nCol;
              puVar2 = &pCVar27[(long)sVar4 + -1].colFlags;
              *puVar2 = *puVar2 | 8;
              local_b8 = pCVar27[(long)sVar4 + -1].zCnName;
              if (local_b8 == (char *)0x0) {
                uStack_b0._0_4_ = 0;
              }
              else {
                sVar16 = strlen(local_b8);
                uStack_b0._0_4_ = (uint)sVar16 & 0x3fffffff;
              }
              pEVar15 = sqlite3ExprAlloc(db,0x3c,(Token *)&local_b8,0);
              local_148 = sqlite3ExprListAppendNew(pParse->db,pEVar15);
              if (local_148 != (ExprList *)0x0) {
                iVar9 = 0;
                if (sortOrder != -1) {
                  iVar9 = sortOrder;
                }
                local_148->a[(long)local_148->nExpr + -1].fg.sortFlags = (u8)iVar9;
                goto LAB_00164c96;
              }
              pList = (ExprList *)0x0;
            }
            else {
              if (pParse->db->aLimit[2] < pList->nExpr) {
                sqlite3ErrorMsg(pParse,"too many columns in %s","index");
              }
              local_148 = pList;
              if (pParse->nErr == 0) {
LAB_00164c96:
                iVar9 = local_148->nExpr;
                iVar28 = 1;
                if (0 < (long)iVar9) {
                  lVar23 = 0;
                  iVar28 = 0;
                  do {
                    pcVar31 = *(char **)((long)&local_148->a[0].pExpr + lVar23);
                    if (*pcVar31 == 'r') {
                      pcVar31 = *(char **)(pcVar31 + 8);
                      if (pcVar31 == (char *)0x0) {
                        iVar10 = 1;
                      }
                      else {
                        sVar16 = strlen(pcVar31);
                        iVar10 = ((uint)sVar16 & 0x3fffffff) + 1;
                      }
                      iVar28 = iVar28 + iVar10;
                    }
                    lVar23 = lVar23 + 0x18;
                  } while ((long)iVar9 * 0x18 != lVar23);
                  iVar28 = iVar28 + 1;
                }
                sVar16 = strlen(zName);
                uVar29 = (uint)sVar16 & 0x3fffffff;
                uVar36 = 1;
                if (pIVar13 != (Index *)0x0) {
                  uVar36 = pIVar13->nKeyCol;
                }
                pIVar17 = sqlite3AllocateIndexObject
                                    (db,(short)iVar9 + uVar36,iVar28 + uVar29,&local_128);
                pcVar31 = local_128;
                if (db->mallocFailed == '\0') {
                  pIVar17->zName = local_128;
                  local_128 = local_128 + (ulong)uVar29 + 1;
                  memcpy(pcVar31,zName,(ulong)uVar29 + 1);
                  pIVar17->pTable = pTVar12;
                  pIVar17->onError = (u8)onError;
                  *(ushort *)&pIVar17->field_0x63 =
                       (ushort)(idxType & 3) + (ushort)(onError != 0) * 8 |
                       *(ushort *)&pIVar17->field_0x63 & 0xfff4;
                  pIVar17->pSchema = db->aDb[(int)iDb].pSchema;
                  pIVar17->nKeyCol = (u16)local_148->nExpr;
                  if (pPIWhere != (Expr *)0x0) {
                    sqlite3ResolveSelfReference(pParse,pTVar12,2,pPIWhere,(ExprList *)0x0);
                    pIVar17->pPartIdxWhere = pPIWhere;
                  }
                  bVar3 = pDVar35->pSchema->file_format;
                  pEVar18 = local_148;
                  if (1 < pParse->eParseMode) {
                    pIVar17->aColExpr = local_148;
                    pEVar18 = (ExprList *)0x0;
                  }
                  if (pIVar17->nKeyCol == 0) {
                    local_168 = (char *)0x0;
                    local_148 = pEVar18;
                  }
                  else {
                    pEVar32 = local_148->a;
                    pPIWhere = (Expr *)0x0;
                    local_168 = (char *)0x0;
                    local_148 = pEVar18;
                    do {
                      pEVar15 = pEVar32->pExpr;
                      pEVar19 = pEVar15;
                      if ((pEVar15->op == 'v') ||
                         ((pEVar15->op == 'r' && (pEVar19 = pEVar15->pLeft, pEVar19->op == 'v')))) {
                        pEVar19->op = '<';
                      }
                      sqlite3ResolveSelfReference(pParse,pTVar12,0x20,pEVar15,(ExprList *)0x0);
                      pEVar24 = pEVar32;
                      if (pParse->nErr != 0) goto LAB_00164d68;
                      do {
                        pEVar15 = pEVar24->pExpr;
                        pEVar24 = (ExprList_item *)&pEVar15->pLeft;
                      } while ((pEVar15->flags & 0x2000) != 0);
                      if (pEVar15->op != 0xa8) {
                        if (pTVar12 != pParse->pNewTable) {
                          if (pIVar17->aColExpr == (ExprList *)0x0) {
                            pIVar17->aColExpr = local_148;
                            local_148 = (ExprList *)0x0;
                          }
                          pIVar17->aiColumn[(long)local_168] = -2;
                          *(ushort *)&pIVar17->field_0x63 =
                               *(ushort *)&pIVar17->field_0x63 & 0xeff7 | 0x1000;
                          pEVar15 = pEVar32->pExpr;
                          if (pEVar15->op != 'r') goto LAB_00164f97;
                          goto LAB_00164f54;
                        }
                        sqlite3ErrorMsg(pParse,
                                        "expressions prohibited in PRIMARY KEY and UNIQUE constraints"
                                       );
LAB_0016523a:
                        pPIWhere = (Expr *)0x0;
                        goto LAB_00164d63;
                      }
                      uVar29 = (uint)pEVar15->iColumn;
                      if (pEVar15->iColumn < 0) {
                        uVar29 = (uint)pTVar12->iPKey;
                      }
                      else {
                        pCVar27 = pTVar12->aCol;
                        if ((pCVar27[uVar29].field_0x8 & 0xf) == 0) {
                          pIVar17->field_0x63 = pIVar17->field_0x63 & 0xf7;
                          pCVar27 = pTVar12->aCol;
                        }
                        if ((pCVar27[uVar29].colFlags & 0x20) != 0) {
                          pIVar17->field_0x64 = pIVar17->field_0x64 | 0x18;
                        }
                      }
                      pIVar17->aiColumn[(long)local_168] = (i16)uVar29;
                      pEVar15 = pEVar32->pExpr;
                      if (pEVar15->op == 'r') {
LAB_00164f54:
                        pcVar26 = (pEVar15->u).zToken;
                        if (pcVar26 == (char *)0x0) {
                          sVar16 = 1;
                        }
                        else {
                          sVar16 = strlen(pcVar26);
                          sVar16 = (ulong)((uint)sVar16 & 0x3fffffff) + 1;
                        }
                        pcVar31 = local_128;
                        memcpy(local_128,pcVar26,sVar16);
                        local_128 = pcVar31 + sVar16;
                      }
                      else {
                        if (-1 < (int)uVar29) {
                          uVar5 = pTVar12->aCol[uVar29].colFlags;
                          if ((uVar5 >> 9 & 1) != 0) {
                            pcVar31 = pTVar12->aCol[uVar29].zCnName + -1;
                            do {
                              pcVar26 = pcVar31 + 1;
                              pcVar31 = pcVar31 + 1;
                            } while (*pcVar26 != '\0');
                            pcVar26 = pcVar31;
                            if ((uVar5 & 4) != 0) {
                              do {
                                pcVar31 = pcVar26 + 1;
                                pcVar1 = pcVar26 + 1;
                                pcVar26 = pcVar31;
                              } while (*pcVar1 != '\0');
                            }
                            pcVar31 = pcVar31 + 1;
                            goto LAB_00164fc8;
                          }
                        }
LAB_00164f97:
                        pcVar31 = (char *)0x0;
                      }
LAB_00164fc8:
                      if (pcVar31 == (char *)0x0) {
                        pcVar31 = "BINARY";
                      }
                      if (((db->init).busy == '\0') &&
                         (pCVar20 = sqlite3LocateCollSeq(pParse,pcVar31), pCVar20 == (CollSeq *)0x0)
                         ) goto LAB_0016523a;
                      uVar8 = '\0';
                      pIVar17->azColl[(long)local_168] = pcVar31;
                      if (3 < bVar3) {
                        uVar8 = (pEVar32->fg).sortFlags;
                      }
                      pIVar17->aSortOrder[(long)local_168] = uVar8;
                      local_168 = (char *)((long)local_168 + 1);
                      pEVar32 = pEVar32 + 1;
                    } while (local_168 < (ulong)pIVar17->nKeyCol);
                  }
                  if (pIVar13 == (Index *)0x0) {
                    pIVar17->aiColumn[(ulong)local_168 & 0xffffffff] = -1;
                    pIVar17->azColl[(ulong)local_168 & 0xffffffff] = "BINARY";
                  }
                  else {
                    uVar36 = pIVar13->nKeyCol;
                    if (uVar36 != 0) {
                      uVar30 = 0;
                      do {
                        iVar9 = isDupColumn(pIVar17,(uint)pIVar17->nKeyCol,pIVar13,(int)uVar30);
                        if (iVar9 == 0) {
                          iVar9 = (int)local_168;
                          pIVar17->aiColumn[iVar9] = pIVar13->aiColumn[uVar30];
                          pIVar17->azColl[iVar9] = pIVar13->azColl[uVar30];
                          pIVar17->aSortOrder[iVar9] = pIVar13->aSortOrder[uVar30];
                          local_168 = (char *)(ulong)(iVar9 + 1);
                          uVar36 = pIVar13->nKeyCol;
                        }
                        else {
                          pIVar17->nColumn = pIVar17->nColumn - 1;
                        }
                        uVar30 = uVar30 + 1;
                      } while (uVar30 < uVar36);
                    }
                  }
                  sqlite3DefaultRowEst(pIVar17);
                  if (pParse->pNewTable == (Table *)0x0) {
                    estimateIndexWidth(pIVar17);
                  }
                  recomputeColumnsNotIndexed(pIVar17);
                  if ((pTblName != (SrcList *)0x0) &&
                     (uVar5 = pIVar17->nColumn, (int)pTVar12->nCol <= (int)(uint)uVar5)) {
                    uVar6 = *(ushort *)&pIVar17->field_0x63;
                    *(ushort *)&pIVar17->field_0x63 = uVar6 | 0x20;
                    if (0 < pTVar12->nCol) {
                      iVar9 = 0;
                      do {
                        if (iVar9 != pTVar12->iPKey) {
                          if ((ulong)uVar5 != 0) {
                            uVar30 = 0;
                            while (pIVar17->aiColumn[uVar30] != (short)iVar9) {
                              uVar30 = uVar30 + 1;
                              if (uVar5 == uVar30) goto LAB_00165244;
                            }
                            if (-1 < (short)uVar30) goto LAB_00165214;
                          }
LAB_00165244:
                          *(ushort *)&pIVar17->field_0x63 = uVar6 & 0xffdf;
                          break;
                        }
LAB_00165214:
                        iVar9 = iVar9 + 1;
                      } while (iVar9 != pTVar12->nCol);
                    }
                  }
                  pList = local_148;
                  if ((pTVar12 == pParse->pNewTable) &&
                     (pIVar13 = pTVar12->pIndex, pIVar13 != (Index *)0x0)) {
                    uVar5 = pIVar17->nKeyCol;
                    do {
                      if (pIVar13->nKeyCol == uVar5) {
                        if ((ulong)uVar5 != 0) {
                          uVar30 = 0;
LAB_00165330:
                          if (pIVar13->aiColumn[uVar30] == pIVar17->aiColumn[uVar30]) {
                            lVar23 = 0;
                            do {
                              bVar3 = pIVar13->azColl[uVar30][lVar23];
                              if (bVar3 == pIVar17->azColl[uVar30][lVar23]) {
                                if ((ulong)bVar3 == 0) goto LAB_00165379;
                              }
                              else if (""[bVar3] != ""[(byte)pIVar17->azColl[uVar30][lVar23]])
                              break;
                              lVar23 = lVar23 + 1;
                            } while( true );
                          }
                          goto LAB_00165385;
                        }
                        uVar30 = 0;
LAB_00165385:
                        if ((uint)uVar30 == (uint)uVar5) {
LAB_001653fa:
                          uVar8 = pIVar13->onError;
                          if (uVar8 != pIVar17->onError) {
                            if ((uVar8 != '\v') && (pIVar17->onError != '\v')) {
                              sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                              uVar8 = pIVar13->onError;
                            }
                            if (uVar8 == '\v') {
                              pIVar13->onError = pIVar17->onError;
                            }
                          }
                          if (idxType == '\x02') {
                            *(ushort *)&pIVar13->field_0x63 =
                                 *(ushort *)&pIVar13->field_0x63 & 0xfffc | 2;
                          }
                          if (pParse->eParseMode < 2) goto LAB_00165481;
                          pIVar17->pNext = pParse->pNewIndex;
                          pParse->pNewIndex = pIVar17;
                          goto LAB_0016546f;
                        }
                      }
                      pIVar13 = pIVar13->pNext;
                    } while (pIVar13 != (Index *)0x0);
                  }
                  if (1 < pParse->eParseMode) {
LAB_0016526e:
                    if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
LAB_001653dc:
                      pIVar17->pNext = pTVar12->pIndex;
                      pTVar12->pIndex = pIVar17;
                      pPIWhere = (Expr *)0x0;
                      goto LAB_001649c5;
                    }
                    if (1 < pParse->eParseMode) {
                      pParse->pNewIndex = pIVar17;
LAB_0016546f:
                      pPIWhere = (Expr *)0x0;
                      goto LAB_001649c5;
                    }
LAB_00165675:
                    pPIWhere = (Expr *)0x0;
                    goto LAB_00164d63;
                  }
                  if ((db->init).busy == '\0') {
                    if ((pTblName != (SrcList *)0x0) || ((pTVar12->tabFlags & 0x80) == 0)) {
                      uVar29 = pParse->nMem + 1;
                      pParse->nMem = uVar29;
                      p = sqlite3GetVdbe(pParse);
                      if (p != (Vdbe *)0x0) {
                        sqlite3BeginWriteOperation(pParse,1,iDb);
                        local_168 = (char *)0x0;
                        PVar11 = sqlite3VdbeAddOp3(p,0xbb,0,0,0);
                        pIVar17->tnum = PVar11;
                        sqlite3VdbeAddOp3(p,0x93,iDb,uVar29,2);
                        if (pStart != (Token *)0x0) {
                          iVar9 = (*(int *)&(pParse->sLastToken).z - (int)local_120->z) +
                                  (pParse->sLastToken).n;
                          pcVar31 = " UNIQUE";
                          if (onError == 0) {
                            pcVar31 = "";
                          }
                          local_168 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar31,
                                                     (ulong)(iVar9 - (uint)(local_120->z
                                                                            [(long)iVar9 + -1] ==
                                                                           ';')));
                        }
                        sqlite3NestedParse(pParse,
                                           "INSERT INTO %Q.sqlite_master VALUES(\'index\',%Q,%Q,#%d,%Q);"
                                           ,db->aDb[(int)iDb].zDbSName,pIVar17->zName,pTVar12->zName
                                           ,(ulong)uVar29,local_168);
                        if (local_168 != (char *)0x0) {
                          sqlite3DbFreeNN(db,local_168);
                        }
                        if (pTblName != (SrcList *)0x0) {
                          sqlite3RefillIndex(pParse,pIVar17,uVar29);
                          sqlite3VdbeAddOp3(pParse->pVdbe,100,iDb,1,
                                            (pParse->db->aDb[(int)iDb].pSchema)->schema_cookie + 1);
                          pcVar31 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",
                                                   pIVar17->zName);
                          sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar31,0);
                          sqlite3VdbeAddOp3(p,0xa6,0,1,0);
                        }
                        if (p->db->mallocFailed == '\0') {
                          pOVar25 = p->aOp + (int)pIVar17->tnum;
                        }
                        else {
                          pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
                        }
                        pOVar25->p2 = p->nOp;
                        goto LAB_0016526e;
                      }
                      goto LAB_00165675;
                    }
                    goto LAB_001653dc;
                  }
                  if (pTblName != (SrcList *)0x0) {
                    PVar11 = (db->init).newTnum;
                    pIVar17->tnum = PVar11;
                    for (pIVar13 = pIVar17->pTable->pIndex; pIVar13 != (Index *)0x0;
                        pIVar13 = pIVar13->pNext) {
                      if ((pIVar13 != pIVar17) && (pIVar13->tnum == PVar11)) {
                        pPIWhere = (Expr *)0x0;
                        sqlite3ErrorMsg(pParse,"invalid rootpage");
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1ee1f,
                                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70"
                                   );
                        pParse->rc = 0xb;
                        goto LAB_00164d63;
                      }
                    }
                  }
                  pvVar21 = sqlite3HashInsert(&pIVar17->pSchema->idxHash,pIVar17->zName,pIVar17);
                  if (pvVar21 == (void *)0x0) {
                    *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
                    goto LAB_0016526e;
                  }
                  sqlite3OomFault(db);
LAB_00165481:
                  pPIWhere = (Expr *)0x0;
                }
                else {
LAB_00164d63:
                  pList = local_148;
                  if (pIVar17 == (Index *)0x0) goto LAB_001649c5;
                }
LAB_00164d68:
                sqlite3FreeIndex(db,pIVar17);
                pList = local_148;
              }
            }
          }
        }
        else {
          zName = sqlite3NameFromToken(db,pName_00);
          if (zName == (char *)0x0) goto LAB_00164b92;
          iVar9 = sqlite3CheckObjectName(pParse,zName,"index",pTVar12->zName);
          if (iVar9 == 0) {
            if (1 < pParse->eParseMode) goto LAB_00164b42;
            pcVar26 = zName;
            if (((db->init).busy == '\0') &&
               (pTVar14 = sqlite3FindTable(db,zName,pDVar35->zDbSName), pTVar14 != (Table *)0x0)) {
              pcVar31 = "there is already a table named %s";
            }
            else {
              pIVar17 = sqlite3FindIndex(db,zName,pDVar35->zDbSName);
              if (pIVar17 == (Index *)0x0) goto LAB_00164ac6;
              if (ifNotExist != 0) {
                sqlite3CodeVerifySchema(pParse,iDb);
                sqlite3ForceNotReadOnly(pParse);
                goto LAB_001649c5;
              }
              pcVar31 = "index %s already exists";
            }
LAB_00164987:
            sqlite3ErrorMsg(pParse,pcVar31,zName);
            zName = pcVar26;
          }
        }
      }
LAB_001649c5:
      pIVar13 = pTVar12->pIndex;
      if (pIVar13 != (Index *)0x0) {
        if (pIVar13->onError == '\x05') {
          ppIVar37 = &pTVar12->pIndex;
        }
        else {
          do {
            pIVar17 = pIVar13;
            pIVar13 = pIVar17->pNext;
            if (pIVar13 == (Index *)0x0) goto LAB_001646b0;
          } while (pIVar13->onError != '\x05');
          ppIVar37 = &pIVar17->pNext;
        }
        while ((pIVar17 = pIVar13->pNext, pIVar17 != (Index *)0x0 && (pIVar17->onError != '\x05')))
        {
          *ppIVar37 = pIVar17;
          ppIVar37 = &pIVar17->pNext;
          pIVar13->pNext = pIVar17->pNext;
          pIVar17->pNext = pIVar13;
        }
      }
      goto LAB_001646b0;
    }
    iDb = sqlite3TwoPartName(pParse,pName1,pName2,&local_120);
    if (-1 < (int)iDb) {
      if ((((db->init).busy == '\0') &&
          (pTVar12 = sqlite3SrcListLookup(pParse,pTblName),
          pTVar12 != (Table *)0x0 && pName2->n == 0)) && (pTVar12->pSchema == db->aDb[1].pSchema)) {
        iDb = 1;
      }
      pName_00 = local_120;
      pDVar35 = pParse->db->aDb;
      pcStack_d0 = pDVar35[iDb].zDbSName;
      pSStack_e0 = pDVar35[iDb].pSchema;
      local_c8 = "index";
      pTStack_c0 = local_120;
      local_d8 = (undefined1 *)CONCAT71(local_d8._1_7_,iDb == 1);
      auStack_110._8_8_ = fixExprCb;
      auStack_110._16_8_ = fixSelectCb;
      auStack_110._24_8_ = sqlite3WalkWinDefnDummyCallback;
      auStack_110._32_8_ = auStack_110._32_8_ & 0xffff000000000000;
      local_e8.pNC = (NameContext *)&local_118;
      local_98 = (ExprList *)0x0;
      local_48 = (Window *)0x0;
      pWStack_40 = (Window *)0x0;
      local_58 = (Expr *)0x0;
      pWStack_50 = (With *)0x0;
      local_68 = (Select *)0x0;
      pSStack_60 = (Select *)0x0;
      local_78 = (Expr *)0x0;
      pEStack_70 = (ExprList *)0x0;
      local_88 = (Expr *)0x0;
      pEStack_80 = (ExprList *)0x0;
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      uStack_a0._0_4_ = 0;
      uStack_a0._4_4_ = 0;
      local_b8 = (char *)0x0;
      uStack_b0._0_4_ = 0;
      uStack_b0._4_4_ = 0;
      local_118 = pParse;
      auStack_110._0_8_ = pParse;
      pSStack_90 = pTblName;
      sqlite3WalkSelect((Walker *)auStack_110,(Select *)&local_b8);
      pTVar12 = sqlite3LocateTableItem(pParse,0,pTblName->a);
      if (pTVar12 != (Table *)0x0) {
        if ((iDb != 1) || (db->aDb[1].pSchema == pTVar12->pSchema)) {
          if ((pTVar12->tabFlags & 0x80) != 0) {
            for (pIVar13 = pTVar12->pIndex; pIVar13 != (Index *)0x0; pIVar13 = pIVar13->pNext) {
              if ((*(ushort *)&pIVar13->field_0x63 & 3) == 2) goto LAB_00164909;
            }
            goto LAB_00164906;
          }
          pIVar13 = (Index *)0x0;
          goto LAB_00164909;
        }
        zName = pTVar12->zName;
        pcVar31 = "cannot create a TEMP index on non-TEMP table \"%s\"";
LAB_00164981:
        pcVar26 = (char *)0x0;
        goto LAB_00164987;
      }
    }
  }
  zName = (char *)0x0;
LAB_001646b0:
  if (pPIWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pPIWhere);
  }
  if (pList != (ExprList *)0x0) {
    exprListDeleteNN(db,pList);
  }
  sqlite3SrcListDelete(db,pTblName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_00165379:
  uVar30 = uVar30 + 1;
  if (uVar30 == uVar5) goto LAB_001653fa;
  goto LAB_00165330;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto exit_create_index;
  }
  assert( db->mallocFailed==0 );
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }
  if( sqlite3HasExplicitNulls(pParse, pList) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initializing a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse,
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0
       && db->init.busy==0
       && pTblName!=0
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_schema table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName,"index",pTab->zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, pDb->zDbSName)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
          sqlite3ForceNotReadOnly(pParse);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder, SQLITE_SO_UNDEFINED);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /*
  ** Allocate the index structure.
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
      pIndex->bHasExpr = 1;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else{
        if( pTab->aCol[j].notNull==0 ){
          pIndex->uniqNotNull = 0;
        }
        if( pTab->aCol[j].colFlags & COLFLAG_VIRTUAL ){
          pIndex->bHasVCol = 1;
          pIndex->bHasExpr = 1;
        }
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      assert( !ExprHasProperty(pListItem->pExpr, EP_IntValue) );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = sqlite3ColumnColl(&pTab->aCol[j]);
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->fg.sortFlags & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( isDupColumn(pIndex, pIndex->nKeyCol, pPk, j) ){
        pIndex->nColumn--;
      }else{
        testcase( hasColumn(pIndex->aiColumn,pIndex->nKeyCol,x) );
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab)
      || pTab->iPKey<0 || sqlite3TableColumnToIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3TableColumnToIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse,
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures.
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash,
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_schema table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_schema
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in
      ** Index.tnum. This is required in case this index is actually a
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = (Pgno)sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      assert( pName!=0 || pStart==0 );
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_schema for this index
      */
      sqlite3NestedParse(pParse,
         "INSERT INTO %Q." LEGACY_SCHEMA_TABLE " VALUES('index',%Q,%Q,#%d,%Q);",
         db->aDb[iDb].zDbSName,
         pIndex->zName,
         pTab->zName,
         iMem,
         zStmt
      );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName), 0);
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, (int)pIndex->tnum);
    }
  }
  if( db->init.busy || pTblName==0 ){
    pIndex->pNext = pTab->pIndex;
    pTab->pIndex = pIndex;
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  if( pTab ){
    /* Ensure all REPLACE indexes on pTab are at the end of the pIndex list.
    ** The list was already ordered when this routine was entered, so at this
    ** point at most a single index (the newly added index) will be out of
    ** order.  So we have to reorder at most one index. */
    Index **ppFrom;
    Index *pThis;
    for(ppFrom=&pTab->pIndex; (pThis = *ppFrom)!=0; ppFrom=&pThis->pNext){
      Index *pNext;
      if( pThis->onError!=OE_Replace ) continue;
      while( (pNext = pThis->pNext)!=0 && pNext->onError!=OE_Replace ){
        *ppFrom = pNext;
        pThis->pNext = pNext->pNext;
        pNext->pNext = pThis;
        ppFrom = &pNext->pNext;
      }
      break;
    }
#ifdef SQLITE_DEBUG
    /* Verify that all REPLACE indexes really are now at the end
    ** of the index list.  In other words, no other index type ever
    ** comes after a REPLACE index on the list. */
    for(pThis = pTab->pIndex; pThis; pThis=pThis->pNext){
      assert( pThis->onError!=OE_Replace
           || pThis->pNext==0
           || pThis->pNext->onError==OE_Replace );
    }
#endif
  }
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}